

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFunction<duckdb::ModeStandard<int>>::
     Finalize<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>>
               (ModeState<int,_duckdb::ModeStandard<int>_> *state,int *target,
               AggregateFinalizeData *finalize_data)

{
  const_iterator cVar1;
  
  if (state->frequency_map != (Counts *)0x0) {
    cVar1 = ModeState<int,_duckdb::ModeStandard<int>_>::Scan(state);
    if (cVar1.super__Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false>._M_cur !=
        (__node_type *)0x0) {
      *target = *(int *)((long)cVar1.
                               super__Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false>
                               ._M_cur + 8);
      return;
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}